

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.c
# Opt level: O1

int ThreadPoolShutdown(ThreadPool *tp)

{
  LinkedList *pLVar1;
  void *pvVar2;
  ThreadPoolJob *element;
  int iVar3;
  ListNode *pLVar4;
  
  iVar3 = 0x16;
  if (tp != (ThreadPool *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)tp);
    pLVar1 = &tp->highJobQ;
    if ((tp->highJobQ).size != 0) {
      do {
        pLVar4 = ListHead(pLVar1);
        if (pLVar4 == (ListNode *)0x0) goto LAB_0011eca1;
        pvVar2 = pLVar4->item;
        if (*(code **)((long)pvVar2 + 0x10) != (code *)0x0) {
          (**(code **)((long)pvVar2 + 0x10))(*(undefined8 *)((long)pvVar2 + 8));
        }
        FreeListFree(&tp->jobFreeList,pvVar2);
        ListDelNode(pLVar1,pLVar4,0);
      } while ((tp->highJobQ).size != 0);
    }
    ListDestroy(pLVar1,0);
    pLVar1 = &tp->medJobQ;
    if ((tp->medJobQ).size != 0) {
      do {
        pLVar4 = ListHead(pLVar1);
        if (pLVar4 == (ListNode *)0x0) goto LAB_0011eca1;
        pvVar2 = pLVar4->item;
        if (*(code **)((long)pvVar2 + 0x10) != (code *)0x0) {
          (**(code **)((long)pvVar2 + 0x10))(*(undefined8 *)((long)pvVar2 + 8));
        }
        FreeListFree(&tp->jobFreeList,pvVar2);
        ListDelNode(pLVar1,pLVar4,0);
      } while ((tp->medJobQ).size != 0);
    }
    ListDestroy(pLVar1,0);
    pLVar1 = &tp->lowJobQ;
    if ((tp->lowJobQ).size != 0) {
      do {
        pLVar4 = ListHead(pLVar1);
        if (pLVar4 == (ListNode *)0x0) {
LAB_0011eca1:
          pthread_mutex_unlock((pthread_mutex_t *)tp);
          return 0x16;
        }
        pvVar2 = pLVar4->item;
        if (*(code **)((long)pvVar2 + 0x10) != (code *)0x0) {
          (**(code **)((long)pvVar2 + 0x10))(*(undefined8 *)((long)pvVar2 + 8));
        }
        FreeListFree(&tp->jobFreeList,pvVar2);
        ListDelNode(pLVar1,pLVar4,0);
      } while ((tp->lowJobQ).size != 0);
    }
    ListDestroy(pLVar1,0);
    element = tp->persistentJob;
    if (element != (ThreadPoolJob *)0x0) {
      if (element->free_func != (free_routine)0x0) {
        (*element->free_func)(element->arg);
      }
      FreeListFree(&tp->jobFreeList,element);
      tp->persistentJob = (ThreadPoolJob *)0x0;
    }
    tp->shutdown = 1;
    pthread_cond_broadcast((pthread_cond_t *)&tp->condition);
    if (0 < tp->totalThreads) {
      do {
        pthread_cond_wait((pthread_cond_t *)&tp->start_and_shutdown,(pthread_mutex_t *)tp);
      } while (0 < tp->totalThreads);
    }
    do {
      iVar3 = pthread_cond_destroy((pthread_cond_t *)&tp->condition);
    } while (iVar3 != 0);
    do {
      iVar3 = pthread_cond_destroy((pthread_cond_t *)&tp->start_and_shutdown);
    } while (iVar3 != 0);
    FreeListDestroy(&tp->jobFreeList);
    pthread_mutex_unlock((pthread_mutex_t *)tp);
    do {
      iVar3 = pthread_mutex_destroy((pthread_mutex_t *)tp);
    } while (iVar3 != 0);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int ThreadPoolShutdown(ThreadPool *tp)
{
	ListNode *head = NULL;
	ThreadPoolJob *temp = NULL;

	if (!tp)
		return EINVAL;
	ithread_mutex_lock(&tp->mutex);
	/* clean up high priority jobs */
	while (tp->highJobQ.size) {
		head = ListHead(&tp->highJobQ);
		if (head == NULL) {
			ithread_mutex_unlock(&tp->mutex);
			return EINVAL;
		}
		temp = (ThreadPoolJob *)head->item;
		if (temp->free_func)
			temp->free_func(temp->arg);
		FreeThreadPoolJob(tp, temp);
		ListDelNode(&tp->highJobQ, head, 0);
	}
	ListDestroy(&tp->highJobQ, 0);
	/* clean up med priority jobs */
	while (tp->medJobQ.size) {
		head = ListHead(&tp->medJobQ);
		if (head == NULL) {
			ithread_mutex_unlock(&tp->mutex);
			return EINVAL;
		}
		temp = (ThreadPoolJob *)head->item;
		if (temp->free_func)
			temp->free_func(temp->arg);
		FreeThreadPoolJob(tp, temp);
		ListDelNode(&tp->medJobQ, head, 0);
	}
	ListDestroy(&tp->medJobQ, 0);
	/* clean up low priority jobs */
	while (tp->lowJobQ.size) {
		head = ListHead(&tp->lowJobQ);
		if (head == NULL) {
			ithread_mutex_unlock(&tp->mutex);
			return EINVAL;
		}
		temp = (ThreadPoolJob *)head->item;
		if (temp->free_func)
			temp->free_func(temp->arg);
		FreeThreadPoolJob(tp, temp);
		ListDelNode(&tp->lowJobQ, head, 0);
	}
	ListDestroy(&tp->lowJobQ, 0);
	/* clean up long term job */
	if (tp->persistentJob) {
		temp = tp->persistentJob;
		if (temp->free_func)
			temp->free_func(temp->arg);
		FreeThreadPoolJob(tp, temp);
		tp->persistentJob = NULL;
	}
	/* signal shutdown */
	tp->shutdown = 1;
	ithread_cond_broadcast(&tp->condition);
	/* wait for all threads to finish */
	while (tp->totalThreads > 0)
		ithread_cond_wait(&tp->start_and_shutdown, &tp->mutex);
	/* destroy condition */
	while (ithread_cond_destroy(&tp->condition) != 0) {
	}
	while (ithread_cond_destroy(&tp->start_and_shutdown) != 0) {
	}
	FreeListDestroy(&tp->jobFreeList);

	ithread_mutex_unlock(&tp->mutex);

	/* destroy mutex */
	while (ithread_mutex_destroy(&tp->mutex) != 0) {
	}

	return 0;
}